

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompileType<unsigned_char>(void)

{
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> i;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_e;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_d;
  Foo local_c;
  
  local_c = Foo1;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<Foo>
            (&local_d,&local_c);
  local_e.m_int = '\0';
  CompiledMixedType<unsigned_char,char>();
  CompiledMixedType<unsigned_char,signed_char>();
  CompiledMixedType<unsigned_char,unsigned_char>();
  CompiledMixedType<unsigned_char,short>();
  CompiledMixedType<unsigned_char,unsigned_short>();
  CompiledMixedType<unsigned_char,int>();
  CompiledMixedType<unsigned_char,unsigned_int>();
  CompiledMixedType<unsigned_char,long>();
  CompiledMixedType<unsigned_char,unsigned_long>();
  CompiledMixedType<unsigned_char,long_long>();
  CompiledMixedType<unsigned_char,unsigned_long_long>();
  ModulusFriendTest<unsigned_char,char>();
  ModulusFriendTest<unsigned_char,signed_char>();
  ModulusFriendTest<unsigned_char,unsigned_char>();
  ModulusFriendTest<unsigned_char,short>();
  ModulusFriendTest<unsigned_char,unsigned_short>();
  ModulusFriendTest<unsigned_char,int>();
  ModulusFriendTest<unsigned_char,unsigned_int>();
  ModulusFriendTest<unsigned_char,long>();
  ModulusFriendTest<unsigned_char,unsigned_long>();
  ModulusFriendTest<unsigned_char,long_long>();
  ModulusFriendTest<unsigned_char,unsigned_long_long>();
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
            (&local_e,0);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++(&local_e)
  ;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--
            (&local_e,0);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--(&local_e)
  ;
  return;
}

Assistant:

void CompileType()
{
	// Test constructors
	SafeInt<T> s;
	SafeInt<T> i(Foo::Foo1);
	T t = 0;
	SafeInt<T> st(t);
	SafeInt<T> sb(false);

	// Mixed operations
	CompiledMixedType<T, char>();
	CompiledMixedType<T, signed char>();
	CompiledMixedType<T, unsigned char>();
	CompiledMixedType<T, short>();
	CompiledMixedType<T, unsigned short>();
	CompiledMixedType<T, int>();
	CompiledMixedType<T, unsigned int>();
	CompiledMixedType<T, long>();
	CompiledMixedType<T, unsigned long>();
	CompiledMixedType<T, long long>();
	CompiledMixedType<T, unsigned long long>();

	// This is making trouble for the compiler
	ModulusFriendTest<T, char>();
	ModulusFriendTest<T, signed char>();
	ModulusFriendTest<T, unsigned char>();
	ModulusFriendTest<T, short>();
	ModulusFriendTest<T, unsigned short>();
	ModulusFriendTest<T, int>();
	ModulusFriendTest<T, unsigned int>();
	ModulusFriendTest<T, long>();
	ModulusFriendTest<T, unsigned long>();
	ModulusFriendTest<T, long long>();
	ModulusFriendTest<T, unsigned long long>();
	
	// Special case casts
	bool b = (bool)s;
	wchar_t w = (wchar_t)s;
	size_t size = (size_t)s;
	float f = (float)s;
	double d = (double)s;
	long double ld = (long double)s;

	// Pointer operations
	T* p1 = s.Ptr();
	const T* p2 = s.Ptr();
	const T& r = s.Ref();
	T* p3 = &s;
	const T* p4 = &s;

	// Unary operators
	bool b2 = !st;
	t = +st;

	st++;
	++st;
	st--;
	--st;
	t = ~st;

	// Get compile time coverage of negation
	T x = 1;
	T result;

	(void)SafeNegation(x, result);

}